

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

void __thiscall asmjit::ConstPool::Tree::put(Tree *this,Node *newNode)

{
  size_t __n;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Node *pNVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  Node *pNVar8;
  Node *stack [64];
  long alStack_240 [66];
  
  __n = this->_dataSize;
  this->_length = this->_length + 1;
  if (this->_root == (Node *)0x0) {
    this->_root = newNode;
  }
  else {
    pNVar8 = this->_root;
    uVar7 = 0;
    do {
      pNVar4 = pNVar8;
      uVar6 = (int)uVar7 + 1;
      uVar5 = (ulong)uVar6;
      alStack_240[uVar7 + 1] = (long)pNVar4;
      alStack_240[0] = 0x15dd51;
      uVar2 = memcmp(pNVar4 + 1,newNode + 1,__n);
      uVar3 = (ulong)(uVar2 >> 0x1f);
      pNVar8 = pNVar4->_link[uVar3];
      uVar7 = uVar5;
    } while (pNVar4->_link[uVar3] != (Node *)0x0);
    pNVar4->_link[uVar3] = newNode;
    if (uVar6 != 0) {
      while( true ) {
        pNVar8 = (Node *)alStack_240[uVar5];
        iVar1 = (int)uVar5;
        if (uVar5 != 1) {
          uVar3 = (ulong)(*(Node **)(alStack_240[(ulong)(iVar1 - 2) + 1] + 8) == pNVar8);
        }
        pNVar4 = pNVar8->_link[0];
        uVar2 = *(uint *)&pNVar8->field_0x10 & 0x7fffffff;
        if ((pNVar4 != (Node *)0x0 && uVar2 != 0) &&
           ((*(uint *)&pNVar4->field_0x10 & 0x7fffffff) == uVar2)) {
          pNVar8->_link[0] = pNVar4->_link[1];
          pNVar4->_link[1] = pNVar8;
          uVar2 = *(uint *)&pNVar4->field_0x10 & 0x7fffffff;
          pNVar8 = pNVar4;
        }
        pNVar4 = pNVar8->_link[1];
        if (((pNVar4 != (Node *)0x0 && uVar2 != 0) && (pNVar4->_link[1] != (Node *)0x0)) &&
           ((*(uint *)&pNVar4->_link[1]->field_0x10 & 0x7fffffff) == uVar2)) {
          pNVar8->_link[1] = pNVar4->_link[0];
          pNVar4->_link[0] = pNVar8;
          *(uint *)&pNVar4->field_0x10 =
               *(uint *)&pNVar4->field_0x10 & 0x80000000 |
               *(uint *)&pNVar4->field_0x10 + 1 & 0x7fffffff;
          pNVar8 = pNVar4;
        }
        if (uVar5 == 1) break;
        uVar5 = uVar5 - 1;
        *(Node **)(alStack_240[(ulong)(iVar1 - 2) + 1] + uVar3 * 8) = pNVar8;
      }
      this->_root = pNVar8;
    }
  }
  return;
}

Assistant:

void ConstPool::Tree::put(ConstPool::Node* newNode) noexcept {
  size_t dataSize = _dataSize;
  _length++;

  if (!_root) {
    _root = newNode;
    return;
  }

  ConstPool::Node* node = _root;
  ConstPool::Node* stack[kHeightLimit];

  unsigned int top = 0;
  unsigned int dir;

  // Find a spot and save the stack.
  for (;;) {
    stack[top++] = node;
    dir = ::memcmp(node->getData(), newNode->getData(), dataSize) < 0;

    ConstPool::Node* link = node->_link[dir];
    if (!link) break;

    node = link;
  }

  // Link and rebalance.
  node->_link[dir] = newNode;

  while (top > 0) {
    // Which child?
    node = stack[--top];

    if (top != 0) {
      dir = stack[top - 1]->_link[1] == node;
    }

    node = ConstPoolTree_skewNode(node);
    node = ConstPoolTree_splitNode(node);

    // Fix the parent.
    if (top != 0)
      stack[top - 1]->_link[dir] = node;
    else
      _root = node;
  }
}